

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::LowerNewClassConstructor(Lowerer *this,Instr *instr)

{
  LowererMD *this_00;
  Instr *pIVar1;
  _func_int *p_Var2;
  Opnd *pOVar3;
  Opnd *pOVar4;
  RegOpnd *baseOpnd;
  RegOpnd *baseOpnd_00;
  Instr *insertBeforeInstr;
  code *pcVar5;
  OpndKind OVar6;
  bool bVar7;
  DWORD DVar8;
  Opnd *pOVar9;
  undefined4 *puVar10;
  RegOpnd *pRVar11;
  IndirOpnd *pIVar12;
  
  pIVar1 = instr->m_prev;
  pOVar9 = IR::Instr::UnlinkSrc1(instr);
  OVar6 = IR::Opnd::GetKind(pOVar9);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar7) goto LAB_005be3c0;
    *puVar10 = 0;
  }
  p_Var2 = pOVar9[1]._vptr_Opnd[5];
  if ((p_Var2 == (_func_int *)0x0) || (*(short *)(p_Var2 + 0x30) != 0x277)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,25999,"(instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A)",
                       "instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A");
    if (!bVar7) goto LAB_005be3c0;
    *puVar10 = 0;
  }
  pOVar9 = *(Opnd **)(p_Var2 + 0x48);
  OVar6 = IR::Opnd::GetKind(pOVar9);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar7) goto LAB_005be3c0;
    *puVar10 = 0;
  }
  pOVar3 = *(Opnd **)(p_Var2 + 0x50);
  OVar6 = IR::Opnd::GetKind(pOVar3);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar7) goto LAB_005be3c0;
    *puVar10 = 0;
  }
  p_Var2 = pOVar3[1]._vptr_Opnd[5];
  if ((p_Var2 == (_func_int *)0x0) || (*(short *)(p_Var2 + 0x30) != 0x277)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6594,"(instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A)",
                       "instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A");
    if (!bVar7) goto LAB_005be3c0;
    *puVar10 = 0;
  }
  pOVar3 = *(Opnd **)(p_Var2 + 0x48);
  OVar6 = IR::Opnd::GetKind(pOVar3);
  if (OVar6 != OpndKindAddr) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
    if (!bVar7) goto LAB_005be3c0;
    *puVar10 = 0;
  }
  pOVar4 = *(Opnd **)(p_Var2 + 0x50);
  OVar6 = IR::Opnd::GetKind(pOVar4);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar7) goto LAB_005be3c0;
    *puVar10 = 0;
  }
  p_Var2 = pOVar4[1]._vptr_Opnd[5];
  if ((p_Var2 == (_func_int *)0x0) || (*(short *)(p_Var2 + 0x30) != 0x277)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6599,"(instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A)",
                       "instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A");
    if (!bVar7) goto LAB_005be3c0;
    *puVar10 = 0;
  }
  baseOpnd = *(RegOpnd **)(p_Var2 + 0x48);
  OVar6 = IR::Opnd::GetKind(&baseOpnd->super_Opnd);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar7) goto LAB_005be3c0;
    *puVar10 = 0;
  }
  pOVar4 = *(Opnd **)(p_Var2 + 0x50);
  OVar6 = IR::Opnd::GetKind(pOVar4);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar7) goto LAB_005be3c0;
    *puVar10 = 0;
  }
  p_Var2 = pOVar4[1]._vptr_Opnd[5];
  if ((p_Var2 == (_func_int *)0x0) || (*(short *)(p_Var2 + 0x30) != 0x277)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x659e,"(instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A)",
                       "instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A");
    if (!bVar7) goto LAB_005be3c0;
    *puVar10 = 0;
  }
  this_00 = &this->m_lowererMD;
  LowererMD::LoadHelperArgument(this_00,instr,*(Opnd **)(p_Var2 + 0x48));
  LowererMD::LoadHelperArgument(this_00,instr,&baseOpnd->super_Opnd);
  LowererMD::LoadHelperArgument(this_00,instr,pOVar3);
  LowererMD::LoadHelperArgument(this_00,instr,pOVar9);
  baseOpnd_00 = (RegOpnd *)instr->m_dst;
  OVar6 = IR::Opnd::GetKind((Opnd *)baseOpnd_00);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar7) {
LAB_005be3c0:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar10 = 0;
  }
  insertBeforeInstr = instr->m_next;
  LowererMD::ChangeToHelperCall
            (this_00,instr,HelperScrFunc_OP_NewClassConstructor,(LabelInstr *)0x0,(Opnd *)0x0,
             (PropertySymOpnd *)0x0,false);
  pRVar11 = IR::RegOpnd::New(TyUint64,this->m_func);
  DVar8 = Js::DynamicObject::GetOffsetOfAuxSlots();
  pIVar12 = IR::IndirOpnd::New(baseOpnd,DVar8,TyUint64,this->m_func,true);
  InsertMove(&pRVar11->super_Opnd,&pIVar12->super_Opnd,insertBeforeInstr,false);
  pIVar12 = IR::IndirOpnd::New(pRVar11,0,TyUint64,this->m_func,true);
  InsertMove(&pIVar12->super_Opnd,(Opnd *)baseOpnd_00,insertBeforeInstr,false);
  pRVar11 = IR::RegOpnd::New(TyUint64,this->m_func);
  DVar8 = Js::DynamicObject::GetOffsetOfAuxSlots();
  pIVar12 = IR::IndirOpnd::New(baseOpnd_00,DVar8,TyUint64,this->m_func,true);
  InsertMove(&pRVar11->super_Opnd,&pIVar12->super_Opnd,insertBeforeInstr,false);
  pIVar12 = IR::IndirOpnd::New(pRVar11,0,TyUint64,this->m_func,true);
  InsertMove(&pIVar12->super_Opnd,&baseOpnd->super_Opnd,insertBeforeInstr,false);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerNewClassConstructor(IR::Instr * instr)
{
    IR::Instr * instrPrev = instr->m_prev;

    IR::RegOpnd * opndLink = instr->UnlinkSrc1()->AsRegOpnd();
    IR::Instr * instrDef = opndLink->m_sym->m_instrDef;
    Assert(instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A);

    IR::RegOpnd * opndEnvironment = instrDef->GetSrc1()->AsRegOpnd();
    opndLink = instrDef->GetSrc2()->AsRegOpnd();
    instrDef = opndLink->m_sym->m_instrDef;
    Assert(instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A);

    IR::AddrOpnd * opndFunctionBodySlot = instrDef->GetSrc1()->AsAddrOpnd();
    opndLink = instrDef->GetSrc2()->AsRegOpnd();
    instrDef = opndLink->m_sym->m_instrDef;
    Assert(instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A);

    IR::RegOpnd * opndProto = instrDef->GetSrc1()->AsRegOpnd();
    opndLink = instrDef->GetSrc2()->AsRegOpnd();
    instrDef = opndLink->m_sym->m_instrDef;
    Assert(instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A);

    IR::Opnd * opndCtorParent = instrDef->GetSrc1();

    m_lowererMD.LoadHelperArgument(instr, opndCtorParent);
    m_lowererMD.LoadHelperArgument(instr, opndProto);
    m_lowererMD.LoadHelperArgument(instr, opndFunctionBodySlot);
    m_lowererMD.LoadHelperArgument(instr, opndEnvironment);

    IR::RegOpnd * opndConstructor = instr->GetDst()->AsRegOpnd();
    IR::Instr * instrNext = instr->m_next;

    m_lowererMD.ChangeToHelperCall(instr, IR::HelperScrFunc_OP_NewClassConstructor);

    // Put constructor in proto's slot 0

    IR::RegOpnd * opndAuxSlots = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(opndAuxSlots, IR::IndirOpnd::New(opndProto, Js::DynamicObject::GetOffsetOfAuxSlots(), TyMachPtr, m_func, true), instrNext, false);
    InsertMove(IR::IndirOpnd::New(opndAuxSlots, 0, TyMachPtr, m_func, true), opndConstructor, instrNext, false);

    // Put proto in constructor's slot 0

    opndAuxSlots = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(opndAuxSlots, IR::IndirOpnd::New(opndConstructor, Js::DynamicObject::GetOffsetOfAuxSlots(), TyMachPtr, m_func, true), instrNext, false);
    InsertMove(IR::IndirOpnd::New(opndAuxSlots, 0, TyMachPtr, m_func, true), opndProto, instrNext, false);

    return instrPrev;
}